

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

ostream * operator<<(ostream *os,v_array<char> *v)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  ostream *in_RDI;
  char *i;
  char *local_18;
  
  std::operator<<(in_RDI,'[');
  for (local_18 = (char *)*in_RSI; local_18 != (char *)in_RSI[1]; local_18 = local_18 + 1) {
    poVar1 = std::operator<<(in_RDI,' ');
    std::operator<<(poVar1,*local_18);
  }
  std::operator<<(in_RDI," ]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<T>& v)
{
  os << '[';
  for (T* i = v._begin; i != v._end; ++i) os << ' ' << *i;
  os << " ]";
  return os;
}